

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void active_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  Fl_Widget_Type *this;
  
  if ((char *)v == "LOAD") {
    Fl_Button::value(&i->super_Fl_Button,~current_widget->o->flags_ & 1);
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar3 != 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    cVar1 = (i->super_Fl_Button).value_;
    bVar2 = false;
    this = (Fl_Widget_Type *)Fl_Type::first;
    do {
      if ((this->super_Fl_Type).selected != '\0') {
        iVar3 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this);
        if (iVar3 != 0) {
          if (cVar1 == '\0') {
            Fl_Widget::deactivate(this->o);
          }
          else {
            Fl_Widget::activate(this->o);
          }
          Fl_Widget_Type::redraw(this);
          bVar2 = true;
        }
      }
      this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
    } while (this != (Fl_Widget_Type *)0x0);
    if (bVar2) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void active_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    i->value(current_widget->o->active());
    if (current_widget->is_window()) i->deactivate();
    else i->activate();
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	n ? q->o->activate() : q->o->deactivate();
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}